

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::
warn<char[15],nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
          (ConsoleLogger *this,char (*args) [15],
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *args_1)

{
  char (*in_RDX) [15];
  ConsoleLogger *in_RSI;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_RDI;
  
  if (*(int *)((long)&in_RDI[6].m_value + 4) < 3) {
    std::mutex::lock((mutex *)in_RDI);
    if ((in_RDI[6].m_value.boolean & 1U) != 0) {
      std::operator<<(*(ostream **)in_RDI,(string *)&in_RDI[2].m_value.boolean);
    }
    std::operator<<(*(ostream **)in_RDI,"[!] ");
    print<char[15],nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
              (in_RSI,in_RDX,in_RDI);
    if ((in_RDI[6].m_value.boolean & 1U) != 0) {
      std::operator<<(*(ostream **)in_RDI,"\x1b[0m");
    }
    std::mutex::unlock((mutex *)0x10ecfd);
  }
  return;
}

Assistant:

void ConsoleLogger::warn(const Args&... args)
{
	if (loglevel > 2) return;
	mtx.lock();
	if (colored) out << warnColor;
	out << "[!] ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
}